

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

CPAccessResult pmreg_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  CPAccessResult CVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar4 = uVar3 == 0x16;
          if (!bVar4) {
            bVar4 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar1 >> 0x1c & 1) == 0) && (uVar3 = 3, bVar4)) goto LAB_0061747c;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061747c:
  if ((((uVar3 != 0) || (CVar2 = CP_ACCESS_TRAP, ((env->cp15).c9_pmuserenr & 1) != 0)) &&
      (((1 < uVar3 || (((env->cp15).mdcr_el2 & 0x40) == 0)) ||
       ((CVar2 = CP_ACCESS_TRAP_EL2, (uVar1 >> 0x21 & 1) != 0 && (((env->cp15).scr_el3 & 1) == 0))))
      )) && ((2 < uVar3 || (CVar2 = CP_ACCESS_TRAP_EL3, ((env->cp15).mdcr_el3 & 0x40) == 0)))) {
    CVar2 = CP_ACCESS_OK;
  }
  return CVar2;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}